

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portfwd.c
# Opt level: O2

void pfd_chan_free(Channel *chan)

{
  if (chan->vt == &PortForwarding_channelvt) {
    pfd_close((PortForwarding *)&chan[-5].initial_fixed_window_size);
    return;
  }
  __assert_fail("chan->vt == &PortForwarding_channelvt",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/portfwd.c",
                0x281,"void pfd_chan_free(Channel *)");
}

Assistant:

static void pfd_chan_free(Channel *chan)
{
    assert(chan->vt == &PortForwarding_channelvt);
    PortForwarding *pf = container_of(chan, PortForwarding, chan);
    pfd_close(pf);
}